

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O0

LispPTR N_OP_aset1(LispPTR data,LispPTR arrayarg,LispPTR inx)

{
  LispPTR LVar1;
  ushort uVar2;
  int iVar3;
  uint LAddr;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  byte *pbVar6;
  DLword *pDVar7;
  uint local_3c;
  uint uStack_38;
  DLword new_6;
  int new_5;
  int new_4;
  int new_3;
  int new_2;
  DLword new_1;
  DLword new;
  int index;
  LispPTR base;
  OneDArray *arrayblk;
  LispPTR inx_local;
  LispPTR arrayarg_local;
  LispPTR data_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (arrayarg >> 9)) ^ 2) & 0x7ff) != 0xe) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  pLVar4 = NativeAligned4FromLAddr(arrayarg);
  if ((inx & 0xfff0000) == 0xe0000) {
    new_2 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (inx >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar5 = NativeAligned4FromLAddr(inx);
    new_2 = *pLVar5;
    if ((new_2 & 0x80000000U) != 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar7 = MDStypetbl;
  if (new_2 < (int)pLVar4[3]) {
    iVar3 = (uint)(ushort)pLVar4[1] + new_2;
    LAddr = *pLVar4 & 0xfffffff;
    uVar2 = (ushort)data;
    arrayarg_local = data;
    switch(*(undefined1 *)((long)pLVar4 + 6)) {
    case 0:
      if ((data & 0xfff0000) == 0xe0000) {
        new_5 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pLVar4 = NativeAligned4FromLAddr(data);
        new_5 = *pLVar4;
        if ((new_5 & 0x80000000U) != 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if (new_5 < 2) {
        if (new_5 == 0) {
          pDVar7 = NativeAligned2FromLAddr(LAddr);
          pbVar6 = (byte *)((long)pDVar7 + (long)(iVar3 >> 3) ^ 3);
          *pbVar6 = *pbVar6 & -(char)(1 << (7 - ((byte)iVar3 & 7) & 0x1f)) - 1U;
        }
        else {
          pDVar7 = NativeAligned2FromLAddr(LAddr);
          pbVar6 = (byte *)((long)pDVar7 + (long)(iVar3 >> 3) ^ 3);
          *pbVar6 = *pbVar6 | (byte)(1 << (7 - ((byte)iVar3 & 7) & 0x1f));
        }
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    default:
      MachineState.errorexit = 1;
      arrayarg_local = 0xffffffff;
      MachineState.tosvalue = inx;
      break;
    case 3:
      if ((data & 0xfff0000) == 0xe0000) {
        uStack_38 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pLVar4 = NativeAligned4FromLAddr(data);
        uStack_38 = *pLVar4;
        if ((uStack_38 & 0x80000000) != 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if ((int)uStack_38 < 0x100) {
        pDVar7 = NativeAligned2FromLAddr(LAddr);
        *(char *)((long)pDVar7 + (long)iVar3 ^ 3) = (char)uStack_38;
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    case 4:
      if ((data & 0xfff0000) == 0xe0000) {
        local_3c = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pLVar4 = NativeAligned4FromLAddr(data);
        local_3c = *pLVar4;
        if ((local_3c & 0x80000000) != 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if ((int)local_3c < 0x10000) {
        pDVar7 = NativeAligned2FromLAddr(LAddr);
        *(short *)((ulong)(pDVar7 + iVar3) ^ 2) = (short)local_3c;
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    case 0x14:
      if ((((data & 0xfff0000) == 0xe0000) && ((data & 0x8000) == 0)) ||
         (((data & 0xfff0000) == 0xf0000 && ((data & 0x8000) != 0)))) {
        pDVar7 = NativeAligned2FromLAddr(LAddr);
        *(ushort *)((ulong)(pDVar7 + iVar3) ^ 2) = uVar2;
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    case 0x16:
      if ((data & 0xfff0000) == 0xe0000) {
        new_4 = data & 0xffff;
      }
      else if ((data & 0xfff0000) == 0xf0000) {
        new_4 = data | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pLVar4 = NativeAligned4FromLAddr(data);
        new_4 = *pLVar4;
      }
      pLVar4 = NativeAligned4FromLAddr(LAddr);
      pLVar4[iVar3] = new_4;
      break;
    case 0x26:
      pLVar4 = NativeAligned4FromLAddr(LAddr);
      if (((*(ushort *)((ulong)(pDVar7 + (pLVar4[iVar3] >> 9)) ^ 2) & 0x8000) == 0) &&
         (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          pLVar4 = NativeAligned4FromLAddr(LAddr);
          rec_htfind(pLVar4[iVar3],1);
        }
        else {
          pLVar4 = NativeAligned4FromLAddr(LAddr);
          htfind(pLVar4[iVar3],1);
        }
      }
      if (((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x8000) == 0) &&
         (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          rec_htfind(data,0);
        }
        else {
          htfind(data,0);
        }
      }
      pLVar4 = NativeAligned4FromLAddr(LAddr);
      pLVar4[iVar3] = data;
      break;
    case 0x36:
      if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) == 3) {
        pLVar4 = NativeAligned4FromLAddr(data);
        LVar1 = *pLVar4;
        pLVar4 = NativeAligned4FromLAddr(LAddr);
        pLVar4[iVar3] = LVar1;
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    case 0x43:
      if ((data & 0xfff0000) == 0x70000) {
        if (uVar2 < 0x100) {
          pDVar7 = NativeAligned2FromLAddr(LAddr);
          *(char *)((long)pDVar7 + (long)iVar3 ^ 3) = (char)data;
        }
        else {
          MachineState.errorexit = 1;
          arrayarg_local = 0xffffffff;
          MachineState.tosvalue = inx;
        }
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    case 0x44:
      if ((data & 0xfff0000) == 0x70000) {
        pDVar7 = NativeAligned2FromLAddr(LAddr);
        *(ushort *)((ulong)(pDVar7 + iVar3) ^ 2) = uVar2;
      }
      else {
        MachineState.errorexit = 1;
        arrayarg_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
      break;
    case 0x56:
      pLVar4 = NativeAligned4FromLAddr(LAddr);
      pLVar4[iVar3] = data;
    }
  }
  else {
    MachineState.errorexit = 1;
    arrayarg_local = 0xffffffff;
    MachineState.tosvalue = inx;
  }
  return arrayarg_local;
}

Assistant:

LispPTR N_OP_aset1(LispPTR data, LispPTR arrayarg, LispPTR inx) {
  OneDArray *arrayblk;
  LispPTR base;
  int index;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_ONED_ARRAY) ERROR_EXIT(inx);
  arrayblk = (OneDArray *)NativeAligned4FromLAddr(arrayarg);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);
  if (index >= arrayblk->totalsize) ERROR_EXIT(inx);
  index += arrayblk->offset;

  /*  setup base  */
  base = arrayblk->base;

  /*  dispatch on type  */
  aset_switch(arrayblk->typenumber, inx);

doufn:
  ERROR_EXIT(inx);

}